

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_30::OwnedFileDescriptor::OwnedFileDescriptor
          (OwnedFileDescriptor *this,int fd,uint flags)

{
  int iVar1;
  Fault FStack_28;
  int opt;
  
  this->fd = fd;
  this->flags = flags;
  if ((flags & 4) == 0) {
    opt = 1;
    do {
      iVar1 = ioctl(fd,0x5421,&opt);
      if (-1 < iVar1) goto LAB_002f4412;
      iVar1 = _::Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      _::Debug::Fault::Fault
                (&FStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x3d,iVar1,"ioctl(fd, FIONBIO, &opt)","");
      _::Debug::Fault::fatal(&FStack_28);
    }
  }
LAB_002f4412:
  if ((flags & 3) == 1) {
    do {
      iVar1 = ioctl(fd,0x5451);
      if (-1 < iVar1) {
        return;
      }
      iVar1 = _::Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      _::Debug::Fault::Fault
                (&FStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x49,iVar1,"ioctl(fd, FIOCLEX)","");
      _::Debug::Fault::fatal(&FStack_28);
    }
  }
  return;
}

Assistant:

OwnedFileDescriptor(int fd, uint flags): fd(fd), flags(flags) {
    if (flags & LowLevelAsyncIoProvider::ALREADY_NONBLOCK) {
      KJ_DREQUIRE(fcntl(fd, F_GETFL) & O_NONBLOCK, "You claimed you set NONBLOCK, but you didn't.");
    } else {
      setNonblocking(fd);
    }

    if (flags & LowLevelAsyncIoProvider::TAKE_OWNERSHIP) {
      if (flags & LowLevelAsyncIoProvider::ALREADY_CLOEXEC) {
        KJ_DREQUIRE(fcntl(fd, F_GETFD) & FD_CLOEXEC,
                    "You claimed you set CLOEXEC, but you didn't.");
      } else {
        setCloseOnExec(fd);
      }
    }
  }